

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIScrollBar::refreshControls(CGUIScrollBar *this)

{
  IGUIButton *pIVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  u32 uVar8;
  uint uVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  CGUIButton *pCVar13;
  EGUI_ALIGNMENT top;
  EGUI_ALIGNMENT left;
  ulong uVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar15;
  IGUIElement *pIVar16;
  int iVar17;
  uint uVar18;
  rect<int> rectangle;
  rect<int> local_40;
  
  (this->CurrentIconColor).color = 0xffffffff;
  plVar11 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar11 == (long *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = (**(code **)(*plVar11 + 0x40))(plVar11);
    bVar7 = (**(code **)(*(long *)this + 0x90))(this);
    uVar8 = (**(code **)*plVar11)(plVar11,(uint)(bVar7 ^ 1) + (uint)(bVar7 ^ 1) * 2 + 0x12);
    (this->CurrentIconColor).color = uVar8;
  }
  pIVar16 = &this->UpButton->super_IGUIElement;
  if (this->Horizontal == true) {
    uVar18 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
    lVar2 = (long)(*(int *)&this->field_0x38 - *(int *)&this->field_0x30);
    uVar3 = lVar2 / 2;
    uVar14 = lVar2 % 2 & 0xffffffff;
    uVar15 = uVar3 & 0xffffffff;
    if ((int)uVar18 < (int)uVar3) {
      uVar15 = (ulong)uVar18;
    }
    iVar17 = (int)uVar15;
    if (pIVar16 == (IGUIElement *)0x0) {
      pCVar13 = (CGUIButton *)operator_new(0x2a8);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar15 | (ulong)uVar18 << 0x20;
      CGUIButton::CGUIButton
                (pCVar13,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar4 << 0x40),(bool)this->field_0xa3);
      this->UpButton = (IGUIButton *)pCVar13;
      (**(code **)(*(long *)pCVar13 + 0x88))(pCVar13,1);
      pIVar16 = &this->UpButton->super_IGUIElement;
      pIVar16->IsTabStop = false;
      uVar14 = extraout_RDX;
    }
    if (lVar12 != 0) {
      (*(((IGUIElement *)&pIVar16->super_IEventReceiver)->super_IEventReceiver)._vptr_IEventReceiver
        [0x31])(pIVar16,lVar12,uVar14);
      pIVar1 = this->UpButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->UpButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar16 = &this->UpButton->super_IGUIElement;
    }
    local_40.UpperLeftCorner.X = 0;
    local_40.UpperLeftCorner.Y = 0;
    local_40.LowerRightCorner.X = iVar17;
    local_40.LowerRightCorner.Y = uVar18;
    IGUIElement::setRelativePosition(pIVar16,&local_40);
    IGUIElement::setAlignment
              (&this->UpButton->super_IGUIElement,EGUIA_UPPERLEFT,EGUIA_UPPERLEFT,EGUIA_UPPERLEFT,
               EGUIA_LOWERRIGHT);
    pIVar16 = &this->DownButton->super_IGUIElement;
    if (pIVar16 == (IGUIElement *)0x0) {
      pCVar13 = (CGUIButton *)operator_new(0x2a8);
      rectangle.LowerRightCorner.X = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      rectangle.UpperLeftCorner.X = rectangle.LowerRightCorner.X - iVar17;
      rectangle.UpperLeftCorner.Y = 0;
      rectangle.LowerRightCorner.Y = uVar18;
      CGUIButton::CGUIButton
                (pCVar13,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,rectangle,
                 (bool)this->field_0xa3);
      this->DownButton = (IGUIButton *)pCVar13;
      (**(code **)(*(long *)pCVar13 + 0x88))(pCVar13,1);
      pIVar16 = &this->DownButton->super_IGUIElement;
      pIVar16->IsTabStop = false;
    }
    if (lVar12 != 0) {
      (*(((IGUIElement *)&pIVar16->super_IEventReceiver)->super_IEventReceiver)._vptr_IEventReceiver
        [0x31])();
      pIVar1 = this->DownButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->DownButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar16 = &this->DownButton->super_IGUIElement;
    }
    local_40.LowerRightCorner.X = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    local_40.UpperLeftCorner.Y = 0;
    local_40.UpperLeftCorner.X = local_40.LowerRightCorner.X - iVar17;
    local_40.LowerRightCorner.Y = uVar18;
    IGUIElement::setRelativePosition(pIVar16,&local_40);
    pIVar16 = &this->DownButton->super_IGUIElement;
    left = EGUIA_LOWERRIGHT;
    top = EGUIA_UPPERLEFT;
  }
  else {
    uVar18 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    lVar2 = (long)(*(int *)&this->field_0x3c - *(int *)&this->field_0x34);
    uVar3 = lVar2 / 2;
    uVar14 = lVar2 % 2 & 0xffffffff;
    uVar15 = uVar3 & 0xffffffff;
    if ((int)uVar18 < (int)uVar3) {
      uVar15 = (ulong)uVar18;
    }
    if (pIVar16 == (IGUIElement *)0x0) {
      pCVar13 = (CGUIButton *)operator_new(0x2a8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)uVar18 + (uVar15 << 0x20);
      CGUIButton::CGUIButton
                (pCVar13,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar5 << 0x40),(bool)this->field_0xa3);
      this->UpButton = (IGUIButton *)pCVar13;
      (**(code **)(*(long *)pCVar13 + 0x88))(pCVar13,1);
      pIVar16 = &this->UpButton->super_IGUIElement;
      pIVar16->IsTabStop = false;
      uVar14 = extraout_RDX_00;
    }
    if (lVar12 != 0) {
      (*(((IGUIElement *)&pIVar16->super_IEventReceiver)->super_IEventReceiver)._vptr_IEventReceiver
        [0x31])(pIVar16,lVar12,uVar14);
      pIVar1 = this->UpButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,5);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->UpButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,5);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar16 = &this->UpButton->super_IGUIElement;
    }
    local_40.UpperLeftCorner.X = 0;
    local_40.UpperLeftCorner.Y = 0;
    iVar17 = (int)uVar15;
    local_40.LowerRightCorner.X = uVar18;
    local_40.LowerRightCorner.Y = iVar17;
    IGUIElement::setRelativePosition(pIVar16,&local_40);
    IGUIElement::setAlignment
              (&this->UpButton->super_IGUIElement,EGUIA_UPPERLEFT,EGUIA_LOWERRIGHT,EGUIA_UPPERLEFT,
               EGUIA_UPPERLEFT);
    pIVar16 = &this->DownButton->super_IGUIElement;
    if (pIVar16 == (IGUIElement *)0x0) {
      pCVar13 = (CGUIButton *)operator_new(0x2a8);
      iVar10 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
      auVar6._8_4_ = iVar10;
      auVar6._4_4_ = uVar18;
      auVar6._0_4_ = iVar10 - iVar17;
      auVar6._12_4_ = 0;
      CGUIButton::CGUIButton
                (pCVar13,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar6 << 0x20),(bool)this->field_0xa3);
      this->DownButton = (IGUIButton *)pCVar13;
      (**(code **)(*(long *)pCVar13 + 0x88))(pCVar13,1);
      pIVar16 = &this->DownButton->super_IGUIElement;
      pIVar16->IsTabStop = false;
    }
    if (lVar12 != 0) {
      (*(((IGUIElement *)&pIVar16->super_IEventReceiver)->super_IEventReceiver)._vptr_IEventReceiver
        [0x31])();
      pIVar1 = this->DownButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,6);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->DownButton;
      uVar9 = (**(code **)(*plVar11 + 0x50))(plVar11,6);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar9,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar16 = &this->DownButton->super_IGUIElement;
    }
    local_40.LowerRightCorner.Y = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
    local_40.UpperLeftCorner =
         (vector2d<int>)((ulong)(uint)(local_40.LowerRightCorner.Y - iVar17) << 0x20);
    local_40.LowerRightCorner.X = uVar18;
    IGUIElement::setRelativePosition(pIVar16,&local_40);
    pIVar16 = &this->DownButton->super_IGUIElement;
    top = EGUIA_LOWERRIGHT;
    left = EGUIA_UPPERLEFT;
  }
  IGUIElement::setAlignment(pIVar16,left,EGUIA_LOWERRIGHT,top,EGUIA_LOWERRIGHT);
  return;
}

Assistant:

void CGUIScrollBar::refreshControls()
{
	CurrentIconColor = video::SColor(255, 255, 255, 255);

	IGUISkin *skin = Environment->getSkin();
	IGUISpriteBank *sprites = 0;

	if (skin) {
		sprites = skin->getSpriteBank();
		CurrentIconColor = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);
	}

	if (Horizontal) {
		const s32 h = RelativeRect.getHeight();
		const s32 w = (h < RelativeRect.getWidth() / 2) ? h : RelativeRect.getWidth() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h));
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	} else {
		const s32 w = RelativeRect.getWidth();
		const s32 h = (w < RelativeRect.getHeight() / 2) ? w : RelativeRect.getHeight() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()));
		DownButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}
}